

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetInfToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte *pbVar1;
  ReservedChars RVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  
  pbVar1 = (byte *)this->cursor_;
  lVar3 = 0;
  pbVar4 = pbVar1;
  while( true ) {
    uVar6 = 0xffffffff;
    pbVar5 = pbVar4;
    if (pbVar4 < this->buffer_end_) {
      pbVar5 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar5;
      uVar6 = (uint)*pbVar4;
    }
    if (uVar6 != (int)"inf"[lVar3]) break;
    lVar3 = lVar3 + 1;
    pbVar4 = pbVar5;
    if (lVar3 == 3) {
      RVar2 = ReadReservedChars(this);
      if (RVar2 == None) {
        LiteralToken(__return_storage_ptr__,this,First_Literal,Infinity);
      }
      else {
        ReadReservedChars(this);
        TextToken(__return_storage_ptr__,this,Reserved,0);
      }
      return __return_storage_ptr__;
    }
  }
  this->cursor_ = (char *)pbVar1;
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetInfToken() {
  if (MatchString("inf")) {
    if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Infinity);
    }
    return GetReservedToken();
  }
  return GetKeywordToken();
}